

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ENUMS::GetEnumAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ENUMS *this,EnumDescriptor *pArray,KUINT32 NumElements,
          KINT32 Value)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  KStringStream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  iVar5 = (int)pArray + -1;
  iVar3 = iVar5;
  iVar4 = 0;
  while( true ) {
    iVar5 = iVar5 / 2;
    if ((*(KUINT32 *)(this + (long)iVar5 * 0x10) == NumElements) || (iVar3 < iVar4)) break;
    iVar1 = iVar5 + 1;
    if ((int)NumElements < (int)*(KUINT32 *)(this + (long)iVar5 * 0x10)) {
      iVar1 = iVar4;
      iVar3 = iVar5 + -1;
    }
    iVar5 = iVar1 + iVar3;
    iVar4 = iVar1;
  }
  if (iVar3 < iVar4) {
    poVar2 = std::operator<<(local_198,"Unknown Enum: ");
    std::ostream::operator<<(poVar2,NumElements);
  }
  else {
    poVar2 = std::operator<<(local_198,*(char **)(this + (long)iVar5 * 0x10 + 8));
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,NumElements);
    std::operator<<(poVar2,")");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString KDIS::DATA_TYPE::ENUMS::GetEnumAsString( const EnumDescriptor * pArray, KUINT32 NumElements, KINT32 Value )
{
    KStringStream ss;
    KINT32 i32Lower = 0, i32Upper = NumElements - 1, i32Middle = ( i32Lower + i32Upper ) / 2;

    while( pArray[i32Middle].Value != Value && i32Lower <= i32Upper )
    {
        if( pArray[i32Middle].Value > Value )
        {
            // Search the left side.
            i32Upper = i32Middle - 1;
        }
        else
        {
            // Search the right side.
            i32Lower = i32Middle + 1;
        }

        i32Middle = ( i32Lower + i32Upper ) / 2;
    }

    if( i32Lower <= i32Upper )
    {
        ss << pArray[i32Middle].Name << "(" << Value << ")";
        return ss.str();
    }

    ss << "Unknown Enum: " << Value;
    return ss.str();
}